

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

void sanitize_player_loc(chunk *c,player *p)

{
  loc grid;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  loc lVar4;
  loc lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  loc lVar10;
  
  lVar4 = (loc)loc(1,1);
  lVar5.x = (p->grid).x;
  lVar5.y = (p->grid).y;
  _Var1 = square_in_bounds_fully((chunk_conflict *)c,lVar5);
  if (((_Var1) &&
      (lVar10.x = (p->grid).x, lVar10.y = (p->grid).y,
      _Var1 = square_isarrivable((chunk_conflict *)c,lVar10), _Var1)) &&
     (grid.x = (p->grid).x, grid.y = (p->grid).y, _Var1 = square_isvault((chunk_conflict *)c,grid),
     !_Var1)) {
    return;
  }
  iVar6 = -1000;
  do {
    uVar2 = Rand_div(c->width + L'\xffffffff');
    uVar3 = Rand_div(c->height + L'\xffffffff');
    lVar5 = (loc)loc(uVar2 + 1,uVar3 + 1);
    _Var1 = square_isempty((chunk_conflict *)c,lVar5);
    if ((_Var1) && (_Var1 = square_isvault((chunk_conflict *)c,lVar5), !_Var1)) {
      (p->grid).x = lVar5.x;
      (p->grid).y = lVar5.y;
      return;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0);
  uVar9 = (ulong)lVar5 >> 0x20;
  uVar8 = (ulong)lVar5 & 0xffffffff;
  do {
    do {
      lVar10 = (loc)(uVar8 | uVar9 << 0x20);
      _Var1 = square_isempty((chunk_conflict *)c,lVar10);
      if ((_Var1) && (_Var1 = square_isvault((chunk_conflict *)c,lVar10), lVar4 = lVar10, !_Var1)) {
        (p->grid).x = (int)uVar8;
        (p->grid).y = (int)uVar9;
        return;
      }
      _Var1 = loc_eq((loc_conflict)lVar10,(loc_conflict)lVar5);
      if (_Var1) {
        (p->grid).x = lVar4.x;
        (p->grid).y = lVar4.y;
        return;
      }
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while ((int)uVar7 < c->width + L'\xffffffff');
    uVar7 = (int)uVar9 + 1;
    uVar8 = 1;
    if (c->height + L'\xffffffff' <= (int)uVar7) {
      uVar7 = 1;
    }
    uVar9 = (ulong)uVar7;
  } while( true );
}

Assistant:

static void sanitize_player_loc(struct chunk *c, struct player *p)
{
	struct loc tgrid, igrid, vgrid = loc(1, 1);
	int try = 1000;

	/* TODO potential problem: stairs in vaults? */

	/* Allow direct transfer if target location is teleportable */
	if (square_in_bounds_fully(c, p->grid)
		&& square_isarrivable(c, p->grid)
		&& !square_isvault(c, p->grid)) {
		return;
	}
	/* TODO should use something similar to teleport code, but this will
	 *  do for now as a quick'n dirty fix
	 */
	/* A bunch of random locations */
	while (try) {
		try = try - 1;
		tgrid = loc(randint0(c->width - 1) + 1, randint0(c->height - 1) + 1);
		if (square_isempty(c, tgrid) && !square_isvault(c, tgrid)) {
			p->grid = tgrid;
			return;
		}
	}

	/* That didnt work, use our last try as an intital grid... */
	igrid = tgrid;

	/* ...and do a full loop through the dungeon */
	while (1) {
		if (square_isempty(c, tgrid)) {
			if (!square_isvault(c, tgrid)) {
				/* OK location */
				p->grid = tgrid;
				return;
			}
			/* Vault, but lets remember it just in case */
			vgrid = tgrid;
		}
		/* Oops tried *every* tile... */
		if (loc_eq(tgrid, igrid)) {
			break;
		}
		tgrid.x++;
		if (tgrid.x >= c->width - 1) {
			tgrid.x = 1;
			tgrid.y++;
			if (tgrid.y >= c->height - 1) {
				tgrid.y = 1;
			}
		}
	}

	/* Fallback vault location (or at least a non-crashy square) */
	p->grid = vgrid;
}